

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcBm.c
# Opt level: O1

int oSplitByDep(Abc_Ntk_t *pNtk,Vec_Int_t **oDep,Vec_Int_t **oMatch,int *oGroup,int *oLastItem,
               int *iGroup)

{
  uint uVar1;
  int iVar2;
  Vec_Int_t *p;
  int *piVar3;
  Vec_Int_t *p_00;
  Vec_Int_t *pVVar4;
  uint uVar5;
  int *piVar6;
  ulong uVar7;
  long lVar8;
  int iVar9;
  int iVar10;
  ulong uVar11;
  ulong uVar12;
  ulong uVar13;
  uint uVar14;
  int *piVar15;
  int iVar16;
  long lVar17;
  long lVar18;
  int iVar19;
  bool bVar20;
  
  iVar9 = *oLastItem;
  if (iVar9 < 1) {
    iVar16 = 0;
  }
  else {
    lVar17 = 0;
    iVar16 = 0;
    do {
      iVar9 = oMatch[lVar17]->nSize;
      if (iVar9 != 1) {
        p = (Vec_Int_t *)malloc(0x10);
        if (iVar9 - 1U < 0xf) {
          iVar9 = 0x10;
        }
        p->nSize = 0;
        p->nCap = iVar9;
        if (iVar9 == 0) {
          piVar3 = (int *)0x0;
        }
        else {
          piVar3 = (int *)malloc((long)iVar9 * 4);
        }
        p->pArray = piVar3;
        p_00 = (Vec_Int_t *)malloc(0x10);
        p_00->nSize = 0;
        p_00->nCap = iVar9;
        if (iVar9 == 0) {
          piVar3 = (int *)0x0;
        }
        else {
          piVar3 = (int *)malloc((long)iVar9 << 2);
        }
        p_00->pArray = piVar3;
        pVVar4 = oMatch[lVar17];
        bVar20 = 0 < pVVar4->nSize;
        if (0 < pVVar4->nSize) {
          lVar18 = 0;
          do {
            if (!bVar20) {
LAB_002978e4:
              __assert_fail("i >= 0 && i < p->nSize",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecInt.h"
                            ,0x1a9,"int Vec_IntEntry(Vec_Int_t *, int)");
            }
            uVar1 = oDep[pVVar4->pArray[lVar18]]->nSize;
            uVar11 = 0;
            uVar7 = (ulong)uVar1;
            if ((int)uVar1 < 1) {
              uVar7 = uVar11;
            }
            iVar9 = 0;
            while (uVar7 != uVar11) {
              iVar9 = iVar9 + iGroup[oDep[pVVar4->pArray[lVar18]]->pArray[uVar11]];
              uVar11 = uVar11 + 1;
              if (!bVar20) goto LAB_002978e4;
            }
            Vec_IntPush(p,iVar9);
            if (0 < (long)p_00->nSize) {
              lVar8 = 0;
              do {
                if (p_00->pArray[lVar8] == iVar9) goto LAB_002975eb;
                lVar8 = lVar8 + 1;
              } while (p_00->nSize != lVar8);
            }
            Vec_IntPushOrder(p_00,iVar9);
LAB_002975eb:
            if (iVar9 < 0) {
              printf("WARNING! Integer overflow!");
            }
            lVar18 = lVar18 + 1;
            pVVar4 = oMatch[lVar17];
            bVar20 = lVar18 < pVVar4->nSize;
          } while (lVar18 < pVVar4->nSize);
        }
        lVar18 = (long)p_00->nSize;
        if (1 < lVar18) {
          iVar9 = iVar16 + p_00->nSize;
          do {
            pVVar4 = oMatch[lVar17];
            if (0 < pVVar4->nSize) {
              uVar7 = 0;
              do {
                iVar19 = (int)uVar7;
                iVar2 = (int)lVar18;
                if (iVar19 < 0) {
LAB_002978d1:
                  p_00->nSize = iVar2;
                  goto LAB_002978e4;
                }
                uVar1 = p->nSize;
                uVar11 = (ulong)uVar1;
                if ((int)uVar1 <= iVar19) goto LAB_002978d1;
                piVar3 = p->pArray;
                if (piVar3[uVar7] == p_00->pArray[lVar18 + -1]) {
                  Vec_IntPush(oMatch[(long)iVar16 + (long)*oLastItem],pVVar4->pArray[uVar7]);
                  pVVar4 = oMatch[lVar17];
                  if (iVar19 < pVVar4->nSize) {
                    piVar6 = pVVar4->pArray;
                    oGroup[piVar6[uVar7]] = *oLastItem + iVar16;
                    uVar5 = pVVar4->nSize;
                    if (iVar19 < (int)uVar5) {
                      uVar12 = 0;
                      bVar20 = 0 < (int)uVar5;
                      if (0 < (int)uVar5) {
                        bVar20 = true;
                        uVar12 = 0;
                        if (*piVar6 != piVar6[uVar7]) {
                          uVar13 = 0;
                          do {
                            if ((ulong)uVar5 - 1 == uVar13) {
                              bVar20 = false;
                              uVar12 = (ulong)uVar5;
                              goto LAB_0029774c;
                            }
                            uVar12 = uVar13 + 1;
                            lVar8 = uVar13 + 1;
                            uVar13 = uVar12;
                          } while (piVar6[lVar8] != piVar6[uVar7]);
                          bVar20 = uVar12 < uVar5;
                        }
                      }
LAB_0029774c:
                      if ((uint)uVar12 != uVar5) {
                        if (!bVar20) {
                          p_00->nSize = iVar2;
                          goto LAB_00297911;
                        }
                        uVar14 = (uint)uVar12 + 1;
                        if ((int)uVar14 < (int)uVar5) {
                          piVar15 = piVar6 + uVar14;
                          do {
                            iVar10 = (int)uVar12;
                            piVar6[uVar12 & 0xffffffff] = *piVar15;
                            uVar5 = pVVar4->nSize;
                            piVar15 = piVar15 + 1;
                            uVar12 = (ulong)(iVar10 + 1);
                          } while (iVar10 + 2 < (int)uVar5);
                        }
                        pVVar4->nSize = uVar5 - 1;
                      }
                      uVar12 = 0;
                      bVar20 = 0 < (int)uVar1;
                      if (0 < (int)uVar1) {
                        bVar20 = true;
                        uVar12 = 0;
                        if (*piVar3 != piVar3[uVar7]) {
                          uVar13 = 0;
                          do {
                            if (uVar11 - 1 == uVar13) {
                              bVar20 = false;
                              uVar12 = uVar11;
                              goto LAB_002977e3;
                            }
                            uVar12 = uVar13 + 1;
                            lVar8 = uVar13 + 1;
                            uVar13 = uVar12;
                          } while (piVar3[lVar8] != piVar3[uVar7]);
                          bVar20 = uVar12 < uVar11;
                        }
                      }
LAB_002977e3:
                      if ((uint)uVar12 != uVar1) {
                        if (!bVar20) {
                          p_00->nSize = iVar2;
LAB_00297911:
                          __assert_fail("i < p->nSize",
                                        "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecInt.h"
                                        ,999,"int Vec_IntRemove(Vec_Int_t *, int)");
                        }
                        uVar5 = (uint)uVar12 + 1;
                        if ((int)uVar5 < (int)uVar1) {
                          piVar6 = piVar3 + uVar5;
                          do {
                            iVar2 = (int)uVar12;
                            piVar3[uVar12 & 0xffffffff] = *piVar6;
                            piVar6 = piVar6 + 1;
                            uVar12 = (ulong)(iVar2 + 1);
                          } while (iVar2 + 2 < (int)uVar1);
                        }
                        p->nSize = uVar1 - 1;
                      }
                      iVar19 = iVar19 + -1;
                      goto LAB_00297821;
                    }
                  }
                  p_00->nSize = iVar2;
                  goto LAB_002978e4;
                }
LAB_00297821:
                uVar7 = (ulong)(iVar19 + 1U);
                pVVar4 = oMatch[lVar17];
              } while ((int)(iVar19 + 1U) < pVVar4->nSize);
            }
            iVar16 = iVar16 + 1;
            lVar18 = lVar18 + -1;
          } while (iVar16 != iVar9 + -1);
        }
        p_00->nSize = (int)lVar18;
        if (p->pArray != (int *)0x0) {
          free(p->pArray);
          p->pArray = (int *)0x0;
        }
        free(p);
        if (p_00->pArray != (int *)0x0) {
          free(p_00->pArray);
          p_00->pArray = (int *)0x0;
        }
        free(p_00);
      }
      lVar17 = lVar17 + 1;
      iVar9 = *oLastItem;
    } while (lVar17 < iVar9);
  }
  *oLastItem = iVar9 + iVar16;
  return iVar16;
}

Assistant:

int oSplitByDep(Abc_Ntk_t *pNtk, Vec_Int_t** oDep, Vec_Int_t** oMatch, int* oGroup, int* oLastItem, int* iGroup)
{
    int i, j, k;
    int numOfItemsAdded;
    Vec_Int_t * array, * sortedArray;    

    numOfItemsAdded = 0;

    for(i = 0; i < *oLastItem; i++)
    {
        if(Vec_IntSize(oMatch[i]) == 1)
            continue;

        array = Vec_IntAlloc( Vec_IntSize(oMatch[i]) );
        sortedArray = Vec_IntAlloc( Vec_IntSize(oMatch[i]) );

        for(j = 0; j < Vec_IntSize(oMatch[i]); j++)
        {
            int factor, encode;

            encode = 0;
            factor = 1;    
            
            for(k = 0; k < Vec_IntSize(oDep[Vec_IntEntry(oMatch[i], j)]); k++)                                        
                encode += iGroup[Vec_IntEntry(oDep[Vec_IntEntry(oMatch[i], j)], k)] * factor;                        
            
            Vec_IntPush(array, encode);
            Vec_IntPushUniqueOrder(sortedArray, encode);

            if( encode < 0)
                printf("WARNING! Integer overflow!");

            //printf("%d ", Vec_IntEntry(array, j));
        }                
        
        while( Vec_IntSize(sortedArray) > 1 )
        {            
            for(k = 0; k < Vec_IntSize(oMatch[i]); k++) 
            {
                if(Vec_IntEntry(array, k) == Vec_IntEntryLast(sortedArray))
                {
                    Vec_IntPush(oMatch[*oLastItem+numOfItemsAdded], Vec_IntEntry(oMatch[i], k));
                    oGroup[Vec_IntEntry(oMatch[i], k)] = *oLastItem+numOfItemsAdded;
                    Vec_IntRemove( oMatch[i], Vec_IntEntry(oMatch[i], k) );        
                    Vec_IntRemove( array, Vec_IntEntry(array, k) );            
                    k--;
                }    
            }            
            numOfItemsAdded++;
            Vec_IntPop(sortedArray);                        
        }

        Vec_IntFree( array );        
        Vec_IntFree( sortedArray );        
        //printf("\n");
    }    

    *oLastItem += numOfItemsAdded;

    /*printf("\n");
    for(j = 0; j < *oLastItem ; j++)
    {
        printf("oMatch %d: ", j);
        for(i = 0; i < Vec_IntSize(oMatch[j]); i++)
            printf("%d ", Vec_IntEntry(oMatch[j], i));
        printf("\n");
    }*/

    return numOfItemsAdded;
}